

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal64.c
# Opt level: O0

void * lyplg_type_print_decimal64
                 (ly_ctx *UNUSED_ctx,lyd_value *value,LY_VALUE_FORMAT format,
                 void *UNUSED_prefix_data,ly_bool *dynamic,size_t *value_len)

{
  ly_ht *plVar1;
  size_t sVar2;
  void *buf;
  int64_t num;
  size_t *value_len_local;
  ly_bool *dynamic_local;
  void *UNUSED_prefix_data_local;
  LY_VALUE_FORMAT format_local;
  lyd_value *value_local;
  ly_ctx *UNUSED_ctx_local;
  
  if (format == LY_VALUE_LYB) {
    plVar1 = (ly_ht *)(value->field_2).dec64;
    if (plVar1 == (ly_ht *)(value->field_2).dec64) {
      *dynamic = '\0';
      if (value_len != (size_t *)0x0) {
        *value_len = 8;
      }
      UNUSED_ctx_local = (ly_ctx *)&value->field_2;
    }
    else {
      UNUSED_ctx_local = (ly_ctx *)calloc(1,8);
      if (UNUSED_ctx_local == (ly_ctx *)0x0) {
        UNUSED_ctx_local = (ly_ctx *)0x0;
      }
      else {
        *dynamic = '\x01';
        if (value_len != (size_t *)0x0) {
          *value_len = 8;
        }
        (UNUSED_ctx_local->dict).hash_tab = plVar1;
      }
    }
  }
  else {
    if (dynamic != (ly_bool *)0x0) {
      *dynamic = '\0';
    }
    if (value_len != (size_t *)0x0) {
      sVar2 = strlen(value->_canonical);
      *value_len = sVar2;
    }
    UNUSED_ctx_local = (ly_ctx *)value->_canonical;
  }
  return UNUSED_ctx_local;
}

Assistant:

LIBYANG_API_DEF const void *
lyplg_type_print_decimal64(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *UNUSED(prefix_data), ly_bool *dynamic, size_t *value_len)
{
    int64_t num = 0;
    void *buf;

    if (format == LY_VALUE_LYB) {
        num = htole64(value->dec64);
        if (num == value->dec64) {
            /* values are equal, little-endian */
            *dynamic = 0;
            if (value_len) {
                *value_len = sizeof value->dec64;
            }
            return &value->dec64;
        } else {
            /* values differ, big-endian */
            buf = calloc(1, sizeof value->dec64);
            LY_CHECK_RET(!buf, NULL);

            *dynamic = 1;
            if (value_len) {
                *value_len = sizeof value->dec64;
            }
            memcpy(buf, &num, sizeof value->dec64);
            return buf;
        }
    }

    /* use the cached canonical value */
    if (dynamic) {
        *dynamic = 0;
    }
    if (value_len) {
        *value_len = strlen(value->_canonical);
    }
    return value->_canonical;
}